

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnData::Select
          (StandardColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,SelectionVector *sel,idx_t sel_count)

{
  TransactionData transaction_00;
  bool bVar1;
  int iVar2;
  optional_ptr<const_duckdb::CompressionFunction,_true> oVar3;
  CompressionFunction *pCVar4;
  idx_t iVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  Vector *in_stack_00000008;
  ColumnScanState *in_stack_00000010;
  idx_t in_stack_00000018;
  Vector *in_stack_00000020;
  ColumnScanState *in_stack_00000028;
  ColumnData *in_stack_00000030;
  bool scan_entire_vector;
  ScanVectorType scan_type;
  idx_t target_count;
  bool validity_has_select;
  optional_ptr<const_duckdb::CompressionFunction,_true> validity_compression;
  bool has_select;
  optional_ptr<const_duckdb::CompressionFunction,_true> compression;
  ColumnData *in_stack_ffffffffffffff48;
  ColumnData *in_stack_ffffffffffffff50;
  bool local_91;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar7;
  CompressionFunction *local_38 [3];
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38[0] = (CompressionFunction *)ColumnData::GetCompressionFunction(in_stack_ffffffffffffff48)
  ;
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_38);
  uVar6 = false;
  if (bVar1) {
    pCVar4 = optional_ptr<const_duckdb::CompressionFunction,_true>::operator->
                       ((optional_ptr<const_duckdb::CompressionFunction,_true> *)
                        in_stack_ffffffffffffff50);
    uVar6 = pCVar4->select != (compression_select_t)0x0;
  }
  bVar7 = uVar6;
  oVar3 = ColumnData::GetCompressionFunction(in_stack_ffffffffffffff48);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0xffffffffffffffb8);
  local_91 = false;
  if (bVar1) {
    pCVar4 = optional_ptr<const_duckdb::CompressionFunction,_true>::operator->
                       ((optional_ptr<const_duckdb::CompressionFunction,_true> *)
                        in_stack_ffffffffffffff50);
    local_91 = pCVar4->select != (compression_select_t)0x0;
  }
  iVar5 = ColumnData::GetVectorCount(in_stack_ffffffffffffff50,(idx_t)in_stack_ffffffffffffff48);
  iVar2 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_18,iVar5,local_20);
  if ((((bVar7 & 1) == 0) || ((local_91 & 1U) == 0)) || (iVar2 != 0)) {
    transaction_00.transaction.ptr._7_1_ = local_91;
    transaction_00.transaction.ptr._0_7_ = in_stack_ffffffffffffffb0;
    transaction_00.transaction_id = (transaction_t)oVar3.ptr;
    transaction_00.start_time._0_7_ = in_stack_ffffffffffffffc0;
    transaction_00.start_time._7_1_ = bVar7;
    ColumnData::Select((ColumnData *)
                       CONCAT44(iVar2,CONCAT13(iVar2 == 0,(int3)in_stack_ffffffffffffffa0)),
                       transaction_00,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                       (SelectionVector *)CONCAT17(uVar6,in_stack_ffffffffffffff80),(idx_t)in_RDI);
  }
  else {
    ColumnData::SelectVector
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               (SelectionVector *)in_stack_00000010,(idx_t)in_stack_00000008);
    vector<duckdb::ColumnScanState,_true>::operator[]
              ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff50,
               (size_type)in_stack_ffffffffffffff48);
    ColumnData::SelectVector
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               (SelectionVector *)in_stack_00000010,(idx_t)in_stack_00000008);
  }
  return;
}

Assistant:

void StandardColumnData::Select(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                                SelectionVector &sel, idx_t sel_count) {
	// check if we can do a specialized select
	// the compression functions need to support this
	auto compression = GetCompressionFunction();
	bool has_select = compression && compression->select;
	auto validity_compression = validity.GetCompressionFunction();
	bool validity_has_select = validity_compression && validity_compression->select;
	auto target_count = GetVectorCount(vector_index);
	auto scan_type = GetVectorScanType(state, target_count, result);
	bool scan_entire_vector = scan_type == ScanVectorType::SCAN_ENTIRE_VECTOR;
	if (!has_select || !validity_has_select || !scan_entire_vector) {
		// we are not scanning an entire vector - this can have several causes (updates, etc)
		ColumnData::Select(transaction, vector_index, state, result, sel, sel_count);
		return;
	}
	SelectVector(state, result, target_count, sel, sel_count);
	validity.SelectVector(state.child_states[0], result, target_count, sel, sel_count);
}